

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

void __thiscall QPlainTextEdit::setPlaceholderText(QPlainTextEdit *this,QString *placeholderText)

{
  bool bVar1;
  QPlainTextEditPrivate *rhs;
  QPlainTextEditPrivate *in_RSI;
  QPlainTextEditPrivate *d;
  
  rhs = d_func((QPlainTextEdit *)0x6c432c);
  bVar1 = ::operator!=((QString *)in_RSI,(QString *)rhs);
  if (bVar1) {
    QString::operator=(&rhs->placeholderText,(QString *)in_RSI);
    QPlainTextEditPrivate::updatePlaceholderVisibility(in_RSI);
  }
  return;
}

Assistant:

void QPlainTextEdit::setPlaceholderText(const QString &placeholderText)
{
    Q_D(QPlainTextEdit);
    if (d->placeholderText != placeholderText) {
        d->placeholderText = placeholderText;
        d->updatePlaceholderVisibility();
    }
}